

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

_Bool ext_ml_model_decision_before_none_part2
                (AV1_COMP *cpi,float *features_from_motion,int *prune_horz,int *prune_vert)

{
  _Bool _Var1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  long in_RSI;
  long in_RDI;
  _Bool valid_decision;
  aom_partition_decision_t decision;
  int i;
  aom_partition_features_t features;
  ExtPartController *ext_part_controller;
  aom_partition_decision_t *in_stack_ffffffffffffd490;
  ExtPartController *in_stack_ffffffffffffd498;
  undefined4 local_b4c;
  undefined4 local_b48;
  int local_b2c;
  undefined4 auStack_ae0 [684];
  int *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  _Bool local_1;
  
  local_30 = (int *)(in_RDI + 0x9d528);
  if (*local_30 == 0) {
    local_1 = false;
  }
  else {
    for (local_b2c = 0; local_b2c < 0x19; local_b2c = local_b2c + 1) {
      auStack_ae0[local_b2c] = *(undefined4 *)(in_RSI + (long)local_b2c * 4);
    }
    local_28 = in_RCX;
    local_20 = in_RDX;
    av1_ext_part_send_features
              (in_stack_ffffffffffffd498,(aom_partition_features_t *)in_stack_ffffffffffffd490);
    _Var1 = av1_ext_part_get_partition_decision(in_stack_ffffffffffffd498,in_stack_ffffffffffffd490)
    ;
    if (_Var1) {
      *local_20 = local_b4c;
      *local_28 = local_b48;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool ext_ml_model_decision_before_none_part2(
    AV1_COMP *cpi,
    const float features_from_motion[FEATURE_SIZE_SMS_PRUNE_PART],
    int *prune_horz, int *prune_vert) {
  ExtPartController *const ext_part_controller = &cpi->ext_part_controller;
  if (!ext_part_controller->ready) return false;

  // Setup features.
  aom_partition_features_t features;
  features.id = AOM_EXT_PART_FEATURE_BEFORE_NONE_PART2;
  for (int i = 0; i < FEATURE_SIZE_SMS_PRUNE_PART; ++i) {
    features.before_part_none.f_part2[i] = features_from_motion[i];
  }

  // Send necessary features to the external model.
  av1_ext_part_send_features(ext_part_controller, &features);

  // Get partition decisions from the external model.
  aom_partition_decision_t decision;
  const bool valid_decision =
      av1_ext_part_get_partition_decision(ext_part_controller, &decision);
  if (!valid_decision) return false;

  // Populate decisions
  *prune_horz = decision.prune_rect_part[HORZ];
  *prune_vert = decision.prune_rect_part[VERT];

  return true;
}